

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

bool __thiscall
llm_tokenizer_bpe_session::append_eos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  char cVar1;
  _Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_> _Var2;
  iterator __position;
  int local_c;
  
  _Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>;
  cVar1 = *(char *)((long)_Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                   0x4e);
  if (cVar1 == '\x01') {
    local_c = *(int *)((long)_Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                      0x14);
    if (local_c == -1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0x1c3,"GGML_ASSERT(%s) failed","vocab.token_eos() != LLAMA_TOKEN_NULL");
    }
    __position._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (output,__position,&local_c);
    }
    else {
      *__position._M_current = local_c;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return (bool)cVar1;
}

Assistant:

bool append_eos(std::vector<llama_token> & output) const {
        if (vocab.get_add_eos()) {
            GGML_ASSERT(vocab.token_eos() != LLAMA_TOKEN_NULL);
            output.push_back(vocab.token_eos());
            return true;
        }
        return false;
    }